

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

Matrix<float,_3,_3> * __thiscall
tcu::Matrix<float,_3,_3>::operator=(Matrix<float,_3,_3> *this,Matrix<float,_3,_3> *src)

{
  float fVar1;
  float *pfVar2;
  undefined4 local_20;
  undefined4 local_1c;
  int col;
  int row;
  Matrix<float,_3,_3> *src_local;
  Matrix<float,_3,_3> *this_local;
  
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      pfVar2 = operator()(src,local_1c,local_20);
      fVar1 = *pfVar2;
      pfVar2 = operator()(this,local_1c,local_20);
      *pfVar2 = fVar1;
    }
  }
  return this;
}

Assistant:

Matrix<T, Rows, Cols>& Matrix<T, Rows, Cols>::operator= (const Matrix<T, Rows, Cols>& src)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = src(row, col);
	return *this;
}